

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

_Bool plutovg_path_parse(plutovg_path_t *path,char *data,int length)

{
  byte *end;
  byte bVar1;
  _Bool _Var2;
  size_t sVar3;
  long lVar4;
  plutovg_path_element_t *ppVar5;
  byte bVar6;
  byte bVar7;
  byte *pbVar8;
  _Bool _Var9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float values [6];
  _Bool flags [2];
  char *it;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_4c;
  float local_48;
  _Bool local_42;
  _Bool local_41;
  byte *local_40;
  float local_38;
  float local_34;
  
  if (length == -1) {
    sVar3 = strlen(data);
    length = (int)sVar3;
  }
  lVar4 = (long)length;
  end = (byte *)(data + lVar4);
  local_40 = (byte *)data;
  if (0 < length) {
    do {
      local_40 = (byte *)data;
      if ((0x20 < (ulong)(byte)*data) || ((0x100002600U >> ((ulong)(byte)*data & 0x3f) & 1) == 0))
      break;
      data = (char *)((byte *)data + 1);
      lVar4 = lVar4 + -1;
      local_40 = end;
    } while (lVar4 != 0);
  }
  _Var9 = end <= local_40;
  if (_Var9) {
    return _Var9;
  }
  fVar11 = 0.0;
  local_34 = 0.0;
  local_38 = 0.0;
  local_70 = 0.0;
  local_6c = 0.0;
  fVar12 = 0.0;
  bVar1 = 0;
  do {
    bVar6 = *local_40;
    bVar7 = bVar1;
    if (((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) &&
       (pbVar8 = local_40 + 1, bVar7 = bVar6, local_40 = pbVar8, pbVar8 < end)) {
      while (local_40 = pbVar8, (ulong)*pbVar8 < 0x21) {
        if (((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0) ||
           (pbVar8 = pbVar8 + 1, local_40 = end, pbVar8 == end)) break;
      }
    }
    bVar6 = bVar7 | 0x20;
    if (bVar1 == 0) {
      if (bVar6 != 0x6d) {
        return _Var9;
      }
LAB_00112b95:
      _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,0,2);
      if (!_Var2) {
        return _Var9;
      }
      bVar10 = bVar7 == 0x6d;
      bVar7 = 0x4c;
      if (bVar10) {
        local_68 = local_6c + local_68;
        local_64 = local_70 + local_64;
        bVar7 = 0x6c;
      }
      fVar12 = local_64;
      fVar11 = local_68;
      ppVar5 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
      (ppVar5->point).x = fVar11;
      (ppVar5->point).y = fVar12;
      (path->start_point).x = fVar11;
      (path->start_point).y = fVar12;
      path->num_contours = path->num_contours + 1;
      local_6c = local_68;
      local_70 = local_64;
      fVar11 = local_64;
      fVar12 = local_68;
    }
    else {
      if (bVar6 == 0x6d) goto LAB_00112b95;
      local_4c = fVar12;
      local_48 = fVar11;
      if (bVar6 == 0x6c) {
        _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,0,2);
        if (!_Var2) {
          return _Var9;
        }
        if (bVar7 == 0x6c) {
          local_68 = local_6c + local_68;
          local_64 = local_70 + local_64;
        }
        plutovg_path_line_to(path,local_68,local_64);
        local_6c = local_68;
        fVar11 = local_48;
        fVar12 = local_4c;
        local_70 = local_64;
      }
      else if (bVar6 == 0x68) {
        _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,0,1);
        if (!_Var2) {
          return _Var9;
        }
        if (bVar7 == 0x68) {
          local_68 = local_6c + local_68;
        }
        plutovg_path_line_to(path,local_68,local_70);
        local_6c = local_68;
        fVar11 = local_48;
        fVar12 = local_4c;
      }
      else if (bVar6 == 0x76) {
        _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,1,1);
        if (!_Var2) {
          return _Var9;
        }
        if (bVar7 == 0x76) {
          local_64 = local_70 + local_64;
        }
        plutovg_path_line_to(path,local_6c,local_64);
        fVar11 = local_48;
        fVar12 = local_4c;
        local_70 = local_64;
      }
      else if (bVar6 == 0x71) {
        _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,0,4);
        if (!_Var2) {
          return _Var9;
        }
        if (bVar7 == 0x71) {
          local_68 = local_68 + local_6c;
          local_64 = local_64 + local_70;
          local_60 = local_6c + local_60;
          local_5c = local_70 + local_5c;
        }
LAB_00112da6:
        plutovg_path_quad_to(path,local_68,local_64,local_60,local_5c);
        local_38 = local_68;
        local_34 = local_64;
        local_6c = local_60;
        fVar11 = local_48;
        fVar12 = local_4c;
        local_70 = local_5c;
      }
      else {
        if (bVar6 == 99) {
          _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,0,6);
          if (!_Var2) {
            return _Var9;
          }
          if (bVar7 == 99) {
            local_68 = local_68 + local_6c;
            local_64 = local_64 + local_70;
LAB_00112e68:
            local_60 = local_60 + local_6c;
            local_5c = local_5c + local_70;
            local_58 = local_6c + local_58;
            local_54 = local_70 + local_54;
          }
        }
        else {
          if (bVar6 == 0x74) {
            if ((bVar1 - 0x51 < 0x24) && ((0x900000009U >> ((ulong)(bVar1 - 0x51) & 0x3f) & 1) != 0)
               ) {
              local_68 = (local_6c + local_6c) - local_38;
              local_64 = (local_70 + local_70) - local_34;
            }
            else {
              local_68 = local_6c;
              local_64 = local_70;
            }
            _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,2,2);
            if (!_Var2) {
              return _Var9;
            }
            if (bVar7 == 0x74) {
              local_60 = local_6c + local_60;
              local_5c = local_70 + local_5c;
            }
            goto LAB_00112da6;
          }
          if (bVar6 != 0x73) {
            if (bVar6 == 0x61) {
              _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,0,3);
              if (!_Var2) {
                return _Var9;
              }
              _Var2 = parse_arc_flag((char **)&local_40,(char *)end,&local_42);
              if (!_Var2) {
                return _Var9;
              }
              _Var2 = parse_arc_flag((char **)&local_40,(char *)end,&local_41);
              if (!_Var2) {
                return _Var9;
              }
              _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,3,2);
              if (!_Var2) {
                return _Var9;
              }
              if (bVar7 == 0x61) {
                local_5c = local_6c + local_5c;
                local_58 = local_70 + local_58;
              }
              plutovg_path_arc_to(path,local_68,local_64,local_60 * 0.017453292,local_42,local_41,
                                  local_5c,local_58);
              local_6c = local_5c;
              fVar11 = local_48;
              fVar12 = local_4c;
              local_70 = local_58;
            }
            else {
              if ((bVar7 & 0xdf) != 0x5a) {
                return _Var9;
              }
              if ((bVar1 & 0xdf) == 0x5a) {
                return _Var9;
              }
              local_70 = fVar11;
              local_6c = fVar12;
              if ((path->elements).size != 0) {
                ppVar5 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CLOSE,1);
                *ppVar5 = *(plutovg_path_element_t *)&path->start_point;
                fVar11 = local_48;
                fVar12 = local_4c;
                local_70 = local_48;
                local_6c = local_4c;
              }
            }
            goto LAB_00112cbc;
          }
          if ((byte)((bVar1 + 0xbd) * '\x10' | (byte)(bVar1 + 0xbd) >> 4) < 4) {
            local_68 = (local_6c + local_6c) - local_38;
            local_64 = (local_70 + local_70) - local_34;
          }
          else {
            local_68 = local_6c;
            local_64 = local_70;
          }
          _Var2 = parse_path_coordinates((char **)&local_40,(char *)end,&local_68,2,4);
          if (!_Var2) {
            return _Var9;
          }
          if (bVar7 == 0x73) goto LAB_00112e68;
        }
        plutovg_path_cubic_to(path,local_68,local_64,local_60,local_5c,local_58,local_54);
        local_38 = local_60;
        local_34 = local_5c;
        local_6c = local_58;
        fVar11 = local_48;
        fVar12 = local_4c;
        local_70 = local_54;
      }
    }
LAB_00112cbc:
    _Var9 = end <= local_40;
    bVar1 = bVar7;
    if (_Var9) {
      return _Var9;
    }
  } while( true );
}

Assistant:

bool plutovg_path_parse(plutovg_path_t* path, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;

    float values[6];
    bool flags[2];

    float start_x = 0;
    float start_y = 0;
    float current_x = 0;
    float current_y = 0;
    float last_control_x = 0;
    float last_control_y = 0;

    char command = 0;
    char last_command = 0;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(PLUTOVG_IS_ALPHA(*it)) {
            command = *it++;
            plutovg_skip_ws(&it, end);
        }

        if(!last_command && !(command == 'M' || command == 'm'))
            return false;
        if(command == 'M' || command == 'm') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'm') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_move_to(path, values[0], values[1]);
            current_x = start_x = values[0];
            current_y = start_y = values[1];
            command = command == 'm' ? 'l' : 'L';
        } else if(command == 'L' || command == 'l') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'l') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_line_to(path, values[0], values[1]);
            current_x = values[0];
            current_y = values[1];
        } else if(command == 'H' || command == 'h') {
            if(!parse_path_coordinates(&it, end, values, 0, 1))
                return false;
            if(command == 'h') {
                values[0] += current_x;
            }

            plutovg_path_line_to(path, values[0], current_y);
            current_x = values[0];
        } else if(command == 'V' || command == 'v') {
            if(!parse_path_coordinates(&it, end, values, 1, 1))
                return false;
            if(command == 'v') {
                values[1] += current_y;
            }

            plutovg_path_line_to(path, current_x, values[1]);
            current_y = values[1];
        } else if(command == 'Q' || command == 'q') {
            if(!parse_path_coordinates(&it, end, values, 0, 4))
                return false;
            if(command == 'q') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'C' || command == 'c') {
            if(!parse_path_coordinates(&it, end, values, 0, 6))
                return false;
            if(command == 'c') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'T' || command == 't') {
            if(last_command != 'Q' && last_command != 'q' && last_command != 'T' && last_command != 't') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 2))
                return false;
            if(command == 't') {
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'S' || command == 's') {
            if(last_command != 'C' && last_command != 'c' && last_command != 'S' && last_command != 's') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 4))
                return false;
            if(command == 's') {
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'A' || command == 'a') {
            if(!parse_path_coordinates(&it, end, values, 0, 3)
                || !parse_arc_flag(&it, end, &flags[0])
                || !parse_arc_flag(&it, end, &flags[1])
                || !parse_path_coordinates(&it, end, values, 3, 2)) {
                return false;
            }

            if(command == 'a') {
                values[3] += current_x;
                values[4] += current_y;
            }

            plutovg_path_arc_to(path, values[0], values[1], PLUTOVG_DEG2RAD(values[2]), flags[0], flags[1], values[3], values[4]);
            current_x = values[3];
            current_y = values[4];
        } else if(command == 'Z' || command == 'z') {
            if(last_command == 'Z' || last_command == 'z')
                return false;
            plutovg_path_close(path);
            current_x = start_x;
            current_y = start_y;
        } else {
            return false;
        }

        last_command = command;
    }

    return true;
}